

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

int ps_config_free(ps_config_t *config)

{
  int iVar1;
  int local_3c;
  int32 i;
  hash_entry_t *e;
  gnode_s *pgStack_28;
  int32 n;
  gnode_t *gn;
  glist_t entries;
  ps_config_t *config_local;
  
  if (config == (ps_config_t *)0x0) {
    config_local._4_4_ = 0;
  }
  else {
    iVar1 = config->refcount + -1;
    config->refcount = iVar1;
    if (iVar1 < 1) {
      entries = (glist_t)config;
      if (config->ht != (hash_table_t *)0x0) {
        pgStack_28 = hash_table_tolist(config->ht,(int32 *)((long)&e + 4));
        gn = pgStack_28;
        for (; pgStack_28 != (glist_t)0x0; pgStack_28 = pgStack_28->next) {
          cmd_ln_val_free(*(cmd_ln_val_t **)((pgStack_28->data).i + 0x10));
        }
        glist_free(gn);
        hash_table_free((hash_table_t *)entries->next);
        entries->next = (gnode_s *)0x0;
      }
      if (entries[1].data.ptr != (void *)0x0) {
        for (local_3c = 0; local_3c < *(int *)&entries[1].next; local_3c = local_3c + 1) {
          ckd_free(*(void **)((long)entries[1].data.ptr + (long)local_3c * 8));
        }
        ckd_free(entries[1].data.ptr);
        entries[1].data.ptr = (void *)0x0;
        *(undefined4 *)&entries[1].next = 0;
      }
      if (entries[2].next != (gnode_s *)0x0) {
        ckd_free(entries[2].next);
      }
      ckd_free(entries);
      config_local._4_4_ = 0;
    }
    else {
      config_local._4_4_ = config->refcount;
    }
  }
  return config_local._4_4_;
}

Assistant:

int
ps_config_free(ps_config_t *config)
{
    if (config == NULL)
        return 0;
    if (--config->refcount > 0)
        return config->refcount;
    if (config->ht) {
        glist_t entries;
        gnode_t *gn;
        int32 n;

        entries = hash_table_tolist(config->ht, &n);
        for (gn = entries; gn; gn = gnode_next(gn)) {
            hash_entry_t *e = (hash_entry_t *)gnode_ptr(gn);
            cmd_ln_val_free((cmd_ln_val_t *)e->val);
        }
        glist_free(entries);
        hash_table_free(config->ht);
        config->ht = NULL;
    }

    if (config->f_argv) {
        int32 i;
        for (i = 0; i < (int32)config->f_argc; ++i) {
            ckd_free(config->f_argv[i]);
        }
        ckd_free(config->f_argv);
        config->f_argv = NULL;
        config->f_argc = 0;
    }
    if (config->json)
        ckd_free(config->json);
    ckd_free(config);
    return 0;
}